

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_ckpt(char *fn)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char local_128 [8];
  char tmp [256];
  FILE *fp;
  char *fn_local;
  
  __stream = fopen(fn,"w");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                   ,0x1ce,"Unable to open chkpt file %s\n",fn);
    fn_local._4_4_ = -1;
  }
  else {
    sprintf(local_128,"%u %u\n",(ulong)(begin + n_proc),(ulong)n_run);
    printf("|%s|\n",local_128);
    iVar1 = fprintf(__stream,"%u %u\n",(ulong)(begin + n_proc),(ulong)n_run);
    sVar2 = strlen(local_128);
    if ((long)iVar1 != sVar2) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
                     ,0x1d7,"Unable to write %s successfully\n",fn);
    }
    fclose(__stream);
    fn_local._4_4_ = 0;
  }
  return fn_local._4_4_;
}

Assistant:

int
corpus_ckpt(const char *fn)
{
    FILE *fp;
    char tmp[256];

    fp = fopen(fn, "w");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open chkpt file %s\n", fn);
	return S3_ERROR;
    }
    
    sprintf(tmp,"%u %u\n", begin + n_proc, n_run); 

    printf("|%s|\n", tmp);

    if (fprintf(fp, "%u %u\n", begin + n_proc, n_run) != strlen(tmp)) {
	E_ERROR_SYSTEM("Unable to write %s successfully\n", fn);
    }

    fclose(fp);
    
    return S3_SUCCESS;
}